

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

int stb_lowbit8(uint n)

{
  int iVar1;
  uint uVar2;
  
  if ((n & 0xf) != 0) {
    return (int)stb_lowbit8::lowbit4[n & 0xf];
  }
  uVar2 = n >> 4 & 0xf;
  iVar1 = stb_lowbit8::lowbit4[uVar2] + 4;
  if (uVar2 == 0) {
    iVar1 = (int)stb_lowbit8::lowbit4[uVar2];
  }
  return iVar1;
}

Assistant:

int stb_lowbit8(unsigned int n)
{
   static signed char lowbit4[16] = { -1,0,1,0, 2,0,1,0, 3,0,1,0, 2,0,1,0 };
   int k = lowbit4[n & 15];
   if (k >= 0) return k;
   k = lowbit4[(n >> 4) & 15];
   if (k >= 0) return k+4;
   return k;
}